

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

void __thiscall UnionType::print(UnionType *this)

{
  raw_ostream *this_00;
  string sStack_38;
  
  this_00 = (raw_ostream *)llvm::outs();
  (*(this->super_AggregateType).super_Type._vptr_Type[3])(&sStack_38,this);
  llvm::raw_ostream::operator<<(this_00,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void UnionType::print() const {
    llvm::outs() << toString();
}